

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t
spvtools::val::FindCaseFallThrough
          (ValidationState_t *_,BasicBlock *target_block,uint32_t *case_fall_through,
          Construct *switch_construct,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *case_targets)

{
  bool bVar1;
  pointer ppBVar2;
  ValidationState_t *pVVar3;
  bool bVar4;
  BasicBlock *pBVar5;
  size_type sVar6;
  pointer ppBVar7;
  spv_result_t sVar8;
  __ireturn_type _Var9;
  value_type block;
  BasicBlock *target_block_local;
  ValidationState_t *local_2d8;
  uint32_t *local_2d0;
  Construct *local_2c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2c0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  string local_2a0;
  string local_280;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  string local_228;
  BasicBlock *successor;
  spv_result_t local_38;
  
  target_block_local = target_block;
  local_2d8 = _;
  local_2d0 = case_fall_through;
  local_2c8 = switch_construct;
  local_2c0 = &case_targets->_M_h;
  pBVar5 = Construct::exit_block(switch_construct);
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            (&stack,&target_block_local);
  visited._M_h._M_buckets = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = target_block_local->structurally_reachable_;
LAB_00563163:
  do {
    do {
      do {
        if (stack.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            stack.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          sVar8 = SPV_SUCCESS;
          goto LAB_0056325b;
        }
        block = stack.
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1];
        stack.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             stack.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
      } while (block == pBVar5);
      _Var9 = std::__detail::
              _Insert_base<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&visited,&block);
    } while (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    if ((bVar1 != false) && (block->structurally_reachable_ == true)) {
      bVar4 = BasicBlock::structurally_dominates(target_block_local,block);
      if (bVar4) {
        ppBVar2 = (block->successors_).
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar7 = (block->successors_).
                       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
            ppBVar7 = ppBVar7 + 1) {
          successor = *ppBVar7;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back(&stack,&successor);
        }
        goto LAB_00563163;
      }
    }
    successor = (BasicBlock *)CONCAT44(successor._4_4_,block->id_);
    sVar6 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(local_2c0,(key_type *)&successor);
    pVVar3 = local_2d8;
    if (sVar6 == 0) {
      bVar4 = Construct::IsStructuredExit(local_2c8,local_2d8,block);
      pVVar3 = local_2d8;
      if (!bVar4) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&successor,local_2d8,SPV_ERROR_INVALID_CFG,
                   target_block_local->label_);
        std::operator<<((ostream *)&successor,"Case construct that targets ");
        ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,target_block_local->id_);
        std::operator<<((ostream *)&successor,(string *)&local_280);
        std::operator<<((ostream *)&successor," has invalid branch to block ");
        ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,block->id_);
        std::operator<<((ostream *)&successor,(string *)&local_2a0);
        std::operator<<((ostream *)&successor,
                        " (not another case construct, corresponding merge, outer loop merge or outer loop continue)"
                       );
        sVar8 = local_38;
LAB_005633ec:
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&successor);
LAB_0056325b:
        std::
        _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&visited._M_h);
        std::_Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ::~_Vector_base(&stack.
                         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                       );
        return sVar8;
      }
    }
    else if (*local_2d0 == 0) {
      if (target_block_local != block) {
        *local_2d0 = block->id_;
      }
    }
    else if (*local_2d0 != block->id_) {
      ValidationState_t::diag
                ((DiagnosticStream *)&successor,local_2d8,SPV_ERROR_INVALID_CFG,
                 target_block_local->label_);
      std::operator<<((ostream *)&successor,"Case construct that targets ");
      ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,target_block_local->id_);
      std::operator<<((ostream *)&successor,(string *)&local_280);
      std::operator<<((ostream *)&successor,
                      " has branches to multiple other case construct targets ");
      ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,*local_2d0);
      std::operator<<((ostream *)&successor,(string *)&local_2a0);
      std::operator<<((ostream *)&successor," and ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,pVVar3,block->id_);
      std::operator<<((ostream *)&successor,(string *)&local_228);
      std::__cxx11::string::_M_dispose();
      sVar8 = local_38;
      goto LAB_005633ec;
    }
  } while( true );
}

Assistant:

spv_result_t FindCaseFallThrough(
    ValidationState_t& _, BasicBlock* target_block, uint32_t* case_fall_through,
    const Construct& switch_construct,
    const std::unordered_set<uint32_t>& case_targets) {
  const auto* merge = switch_construct.exit_block();
  std::vector<BasicBlock*> stack;
  stack.push_back(target_block);
  std::unordered_set<const BasicBlock*> visited;
  bool target_reachable = target_block->structurally_reachable();
  while (!stack.empty()) {
    auto block = stack.back();
    stack.pop_back();

    if (block == merge) continue;

    if (!visited.insert(block).second) continue;

    if (target_reachable && block->structurally_reachable() &&
        target_block->structurally_dominates(*block)) {
      // Still in the case construct.
      for (auto successor : *block->successors()) {
        stack.push_back(successor);
      }
    } else {
      // Exiting the case construct to non-merge block.
      if (!case_targets.count(block->id())) {
        // We have already filtered out the following:
        //  * The switch's merge
        //  * Other case targets
        //  * Blocks in the same case construct
        //
        // So the only remaining valid branches are the structured exits from
        // the overall selection construct of the switch.
        if (switch_construct.IsStructuredExit(_, block)) {
          continue;
        }

        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has invalid branch to block " << _.getIdName(block->id())
               << " (not another case construct, corresponding merge, outer "
                  "loop merge or outer loop continue)";
      }

      if (*case_fall_through == 0u) {
        if (target_block != block) {
          *case_fall_through = block->id();
        }
      } else if (*case_fall_through != block->id()) {
        // Case construct has at most one branch to another case construct.
        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has branches to multiple other case construct targets "
               << _.getIdName(*case_fall_through) << " and "
               << _.getIdName(block->id());
      }
    }
  }

  return SPV_SUCCESS;
}